

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixel.h
# Opt level: O1

type dlib::assign_pixel_helpers::assign<dlib::hsi_pixel,dlib::rgb_pixel>
               (hsi_pixel *dest,rgb_pixel *src)

{
  ushort uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar3 = (double)src->red / 255.0;
  uVar1._0_1_ = src->green;
  uVar1._1_1_ = src->blue;
  auVar7._0_8_ = (double)(uVar1 & 0xff);
  auVar7._8_8_ = (double)(byte)uVar1._1_1_;
  auVar7 = divpd(auVar7,_DAT_002d0e30);
  dVar6 = auVar7._0_8_;
  dVar8 = auVar7._8_8_;
  dVar2 = dVar8;
  if (dVar6 <= dVar8) {
    dVar2 = dVar6;
  }
  if (dVar3 <= dVar2) {
    dVar2 = dVar3;
  }
  dVar4 = dVar8;
  if (dVar8 <= dVar6) {
    dVar4 = dVar6;
  }
  if (dVar4 <= dVar3) {
    dVar4 = dVar3;
  }
  dVar9 = dVar4 - dVar2;
  dVar2 = (dVar2 + dVar4) * 0.5;
  dVar10 = 0.0;
  dVar5 = 0.0;
  if ((0.0 < dVar2) && (dVar5 = 0.0, dVar2 < 1.0)) {
    dVar5 = dVar9 / (double)(~-(ulong)(dVar2 < 0.5) & (ulong)(2.0 - (dVar2 + dVar2)) |
                            (ulong)(dVar2 + dVar2) & -(ulong)(dVar2 < 0.5));
  }
  if (0.0 < dVar9) {
    dVar10 = (double)(-(ulong)(dVar4 == dVar3) &
                     -(ulong)(dVar4 != dVar6) & (ulong)((dVar6 - dVar8) / dVar9 + 0.0));
    if (dVar4 != dVar8 && dVar4 == dVar6) {
      dVar10 = (dVar8 - dVar3) / dVar9 + 2.0 + dVar10;
    }
    dVar10 = (double)(~-(ulong)(dVar8 == dVar4) & (ulong)dVar10 |
                     ((ulong)((dVar3 - dVar6) / dVar9 + 4.0 + dVar10) & -(ulong)(dVar4 != dVar3) |
                     ~-(ulong)(dVar4 != dVar3) & (ulong)dVar10) & -(ulong)(dVar8 == dVar4)) * 60.0;
  }
  dest->h = (uchar)(int)((dVar10 / 360.0) * 255.0 + 0.5);
  dest->s = (uchar)(int)(dVar5 * 255.0 + 0.5);
  dest->i = (uchar)(int)(dVar2 * 255.0 + 0.5);
  return;
}

Assistant:

typename enable_if_c<pixel_traits<P1>::hsi && pixel_traits<P2>::rgb>::type
        assign(P1& dest, const P2& src) 
        { 
            COLOUR c1;
            HSL c2;
            c1.r = src.red/255.0;
            c1.g = src.green/255.0;
            c1.b = src.blue/255.0;
            c2 = RGB2HSL(c1);

            dest.h = static_cast<unsigned char>(c2.h/360.0*255.0 + 0.5);
            dest.s = static_cast<unsigned char>(c2.s*255.0 + 0.5);
            dest.i = static_cast<unsigned char>(c2.l*255.0 + 0.5);
        }